

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O0

string * __thiscall
flatbuffers::Namer::Format(string *__return_storage_ptr__,Namer *this,string *s,Case casing)

{
  string local_78;
  string local_48;
  Case local_24;
  string *psStack_20;
  Case casing_local;
  string *s_local;
  Namer *this_local;
  
  local_24 = casing;
  psStack_20 = s;
  s_local = (string *)this;
  this_local = (Namer *)__return_storage_ptr__;
  if ((this->config_).escape_keywords == BeforeConvertingCase) {
    (*this->_vptr_Namer[0xe])(&local_48,this,s);
    ConvertCase(__return_storage_ptr__,&local_48,local_24,kLowerCamel);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    ConvertCase(&local_78,s,casing,kLowerCamel);
    (*this->_vptr_Namer[0xe])(__return_storage_ptr__,this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Format(const std::string &s, Case casing) const {
    if (config_.escape_keywords == Config::Escape::BeforeConvertingCase) {
      return ConvertCase(EscapeKeyword(s), casing, Case::kLowerCamel);
    } else {
      return EscapeKeyword(ConvertCase(s, casing, Case::kLowerCamel));
    }
  }